

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

WeierstrassPoint *
ecc_weierstrass_point_new_imported(WeierstrassCurve *wc,mp_int *monty_x,mp_int *monty_y)

{
  WeierstrassPoint *pWVar1;
  mp_int *pmVar2;
  
  pWVar1 = (WeierstrassPoint *)safemalloc(1,0x20,0);
  pWVar1->wc = wc;
  pWVar1->Z = (mp_int *)0x0;
  pWVar1->X = monty_x;
  pWVar1->Y = monty_y;
  pmVar2 = monty_identity(wc->mc);
  pmVar2 = mp_copy(pmVar2);
  pWVar1->Z = pmVar2;
  return pWVar1;
}

Assistant:

static WeierstrassPoint *ecc_weierstrass_point_new_imported(
    WeierstrassCurve *wc, mp_int *monty_x, mp_int *monty_y)
{
    WeierstrassPoint *wp = ecc_weierstrass_point_new_empty(wc);
    wp->X = monty_x;
    wp->Y = monty_y;
    wp->Z = mp_copy(monty_identity(wc->mc));
    return wp;
}